

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O0

void mathCore::DeMorgansD(expression *a)

{
  bool bVar1;
  reference ppeVar2;
  expression *child_1;
  iterator __end3;
  iterator __begin3;
  expSet *__range3;
  expression *child;
  iterator __end2;
  iterator __begin2;
  expSet *__range2;
  expression *a_local;
  
  bVar1 = is_and(a);
  if (bVar1) {
    dual(a);
    trans_or(a);
    __end2 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                       (&a->contents);
    child = (expression *)
            std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                      (&a->contents);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&child), bVar1) {
      ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*(&__end2);
      dual(*ppeVar2);
      std::_Rb_tree_const_iterator<expression_*>::operator++(&__end2);
    }
  }
  else {
    bVar1 = is_or(a);
    if (bVar1) {
      dual(a);
      trans_and(a);
      __end3 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                         (&a->contents);
      child_1 = (expression *)
                std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                          (&a->contents);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&child_1), bVar1) {
        ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*(&__end3);
        dual(*ppeVar2);
        std::_Rb_tree_const_iterator<expression_*>::operator++(&__end3);
      }
    }
  }
  return;
}

Assistant:

void mathCore::DeMorgansD(expression* a) {
	if (mathCore::is_and(a)) {
		dual(a);
		trans_or(a);
		for (auto child : a->contents) {
			dual(child);
		}
	}
	else if (mathCore::is_or(a)) {
		dual(a);
		trans_and(a);
		for (auto child : a->contents) {
			dual(child);
		}
	}
}